

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucase.cpp
# Opt level: O2

int32_t ucase_toFullLower_63
                  (UChar32 c,UCaseContextIterator *iter,void *context,UChar **pString,int32_t loc)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  UBool UVar4;
  UChar32 UVar5;
  int32_t iVar6;
  uint uVar7;
  ushort *puVar8;
  ulong uVar9;
  UChar *pUVar10;
  ulong uVar11;
  int8_t iVar12;
  uint uVar13;
  ushort *puVar14;
  
  if ((uint)c < 0xd800) {
    uVar7 = (uint)c >> 5;
LAB_00298b37:
    uVar9 = (ulong)((c & 0x1fU) + (uint)ucase_props_trieIndex[uVar7] * 4);
  }
  else {
    if ((uint)c < 0x10000) {
      uVar7 = ((uint)c >> 5) + 0x140;
      if (0xdbff < (uint)c) {
        uVar7 = (uint)c >> 5;
      }
      goto LAB_00298b37;
    }
    uVar9 = 0xd30;
    if (((uint)c < 0x110000) && (uVar9 = 0x2f1c, (uint)c < 0xe0800)) {
      uVar7 = ((uint)c >> 5 & 0x3f) + (uint)ucase_props_trieIndex[(ulong)((uint)c >> 0xb) + 0x820];
      goto LAB_00298b37;
    }
  }
  uVar1 = ucase_props_trieIndex[uVar9];
  uVar7 = c;
  if ((uVar1 & 8) == 0) {
    if ((uVar1 & 2) != 0) {
      uVar7 = ((int)(short)uVar1 >> 7) + c;
    }
    goto LAB_00298b6f;
  }
  uVar9 = (ulong)(uVar1 >> 4);
  puVar14 = ucase_props_exceptions + uVar9 + 1;
  uVar2 = ucase_props_exceptions[uVar9];
  if ((uVar2 >> 0xe & 1) == 0) {
    if ((char)uVar2 < '\0') {
      puVar8 = (ushort *)(uVar9 * 2 + 0x3003c4 + (ulong)""[uVar2 & 0x7f] * 4);
      if ((uVar2 >> 8 & 1) == 0) {
        puVar8 = puVar14 + ""[uVar2 & 0x7f];
      }
      uVar3 = *puVar8;
      if ((uVar3 & 0xf) != 0) {
        *pString = (UChar *)(puVar8 + 1);
        return uVar3 & 0xf;
      }
    }
LAB_00298ea1:
    if (((uVar1 & 2) != 0) && ((uVar2 & 0x10) != 0)) {
      uVar11 = (ulong)""[uVar2 & 0xf];
      if ((uVar2 >> 8 & 1) == 0) {
        uVar7 = (uint)puVar14[uVar11];
      }
      else {
        uVar7 = CONCAT22(puVar14[uVar11 * 2],*(undefined2 *)(uVar9 * 2 + 0x3003c4 + uVar11 * 4));
      }
      uVar13 = -uVar7;
      if ((uVar2 >> 10 & 1) == 0) {
        uVar13 = uVar7;
      }
      return uVar13 + c;
    }
    if ((uVar2 & 1) != 0) {
      if ((uVar2 >> 8 & 1) == 0) {
        uVar7 = (uint)*puVar14;
      }
      else {
        uVar7 = CONCAT22(ucase_props_exceptions[uVar9 + 1],ucase_props_exceptions[uVar9 + 2]);
      }
    }
LAB_00298b6f:
    return -(uint)(uVar7 == c) ^ uVar7;
  }
  if (loc == 3) {
    if (c - 0x49U < 2) {
LAB_00298c88:
      if (iter != (UCaseContextIterator *)0x0) {
        iVar12 = '\x01';
        do {
          UVar5 = (*iter)(context,iVar12);
          if (UVar5 < 0) goto LAB_00298d08;
          iVar6 = getDotType(UVar5);
          iVar12 = '\0';
        } while (iVar6 == 0x60);
        if (iVar6 == 0x40) {
          if (c == 0x12e) {
            pUVar10 = L"į̇";
            goto LAB_00298e99;
          }
          if (c == 0x4a) {
            pUVar10 = L"j̇";
            goto LAB_00298e99;
          }
          if (c != 0xcc) {
            if (c != 0xcd) {
              if (c != 0x128) {
                if (c != 0x49) {
                  return 0;
                }
                goto LAB_00298e92;
              }
              goto LAB_00298d36;
            }
            goto LAB_00298e63;
          }
          goto LAB_00298e6c;
        }
      }
LAB_00298d08:
      if (c != 0xcc) {
        if (c == 0xcd) {
LAB_00298e63:
          pUVar10 = L"i̇́";
          goto LAB_00298e73;
        }
        if (c == 0x128) {
LAB_00298d36:
          pUVar10 = L"i̇̃";
          goto LAB_00298e73;
        }
        goto LAB_00298d42;
      }
    }
    else if (c != 0xcc) {
      if (c == 0xcd) goto LAB_00298e63;
      if (c == 0x128) goto LAB_00298d36;
      if (c != 0x3a3) {
        if (c != 0x130) {
          if (c != 0x12e) goto LAB_00298ea1;
          goto LAB_00298c88;
        }
        goto LAB_00298e92;
      }
LAB_00298e14:
      UVar4 = isFollowedByCasedLetter(iter,context,'\x01');
      if ((UVar4 == '\0') && (UVar4 = isFollowedByCasedLetter(iter,context,-1), UVar4 != '\0')) {
        return 0x3c2;
      }
      goto LAB_00298ea1;
    }
LAB_00298e6c:
    pUVar10 = L"i̇̀";
LAB_00298e73:
    *pString = pUVar10;
    return 3;
  }
LAB_00298d42:
  uVar13 = loc ^ 2;
  if (c == 0x130 && uVar13 == 0) {
    return 0x69;
  }
  if (c == 0x307 && uVar13 == 0) {
    if (iter != (UCaseContextIterator *)0x0) {
      iVar12 = -1;
      do {
        UVar5 = (*iter)(context,iVar12);
        if (UVar5 < 0) break;
        if (UVar5 == 0x49) {
          *pString = (UChar *)0x0;
          return 0;
        }
        iVar6 = getDotType(UVar5);
        iVar12 = '\0';
      } while (iVar6 == 0x60);
      goto LAB_00298da1;
    }
    if (c != 0x130) goto LAB_00298ea1;
  }
  else {
LAB_00298da1:
    if (c == 0x49 && uVar13 == 0) {
      if (iter == (UCaseContextIterator *)0x0) {
        return 0x131;
      }
      iVar12 = '\x01';
      while( true ) {
        UVar5 = (*iter)(context,iVar12);
        if (UVar5 < 0) {
          return 0x131;
        }
        if (UVar5 == 0x307) break;
        iVar6 = getDotType(UVar5);
        iVar12 = '\0';
        if (iVar6 != 0x60) {
          return 0x131;
        }
      }
    }
    if (c != 0x130) {
      if (c == 0x3a3) goto LAB_00298e14;
      goto LAB_00298ea1;
    }
  }
LAB_00298e92:
  pUVar10 = L"i̇";
LAB_00298e99:
  *pString = pUVar10;
  return 2;
}

Assistant:

U_CAPI int32_t U_EXPORT2
ucase_toFullLower(UChar32 c,
                  UCaseContextIterator *iter, void *context,
                  const UChar **pString,
                  int32_t loc) {
    // The sign of the result has meaning, input must be non-negative so that it can be returned as is.
    U_ASSERT(c >= 0);
    UChar32 result=c;
    uint16_t props=UTRIE2_GET16(&ucase_props_singleton.trie, c);
    if(!UCASE_HAS_EXCEPTION(props)) {
        if(UCASE_IS_UPPER_OR_TITLE(props)) {
            result=c+UCASE_GET_DELTA(props);
        }
    } else {
        const uint16_t *pe=GET_EXCEPTIONS(&ucase_props_singleton, props), *pe2;
        uint16_t excWord=*pe++;
        int32_t full;

        pe2=pe;

        if(excWord&UCASE_EXC_CONDITIONAL_SPECIAL) {
            /* use hardcoded conditions and mappings */

            /*
             * Test for conditional mappings first
             *   (otherwise the unconditional default mappings are always taken),
             * then test for characters that have unconditional mappings in SpecialCasing.txt,
             * then get the UnicodeData.txt mappings.
             */
            if( loc==UCASE_LOC_LITHUANIAN &&
                    /* base characters, find accents above */
                    (((c==0x49 || c==0x4a || c==0x12e) &&
                        isFollowedByMoreAbove(iter, context)) ||
                    /* precomposed with accent above, no need to find one */
                    (c==0xcc || c==0xcd || c==0x128))
            ) {
                /*
                    # Lithuanian

                    # Lithuanian retains the dot in a lowercase i when followed by accents.

                    # Introduce an explicit dot above when lowercasing capital I's and J's
                    # whenever there are more accents above.
                    # (of the accents used in Lithuanian: grave, acute, tilde above, and ogonek)

                    0049; 0069 0307; 0049; 0049; lt More_Above; # LATIN CAPITAL LETTER I
                    004A; 006A 0307; 004A; 004A; lt More_Above; # LATIN CAPITAL LETTER J
                    012E; 012F 0307; 012E; 012E; lt More_Above; # LATIN CAPITAL LETTER I WITH OGONEK
                    00CC; 0069 0307 0300; 00CC; 00CC; lt; # LATIN CAPITAL LETTER I WITH GRAVE
                    00CD; 0069 0307 0301; 00CD; 00CD; lt; # LATIN CAPITAL LETTER I WITH ACUTE
                    0128; 0069 0307 0303; 0128; 0128; lt; # LATIN CAPITAL LETTER I WITH TILDE
                 */
                switch(c) {
                case 0x49:  /* LATIN CAPITAL LETTER I */
                    *pString=iDot;
                    return 2;
                case 0x4a:  /* LATIN CAPITAL LETTER J */
                    *pString=jDot;
                    return 2;
                case 0x12e: /* LATIN CAPITAL LETTER I WITH OGONEK */
                    *pString=iOgonekDot;
                    return 2;
                case 0xcc:  /* LATIN CAPITAL LETTER I WITH GRAVE */
                    *pString=iDotGrave;
                    return 3;
                case 0xcd:  /* LATIN CAPITAL LETTER I WITH ACUTE */
                    *pString=iDotAcute;
                    return 3;
                case 0x128: /* LATIN CAPITAL LETTER I WITH TILDE */
                    *pString=iDotTilde;
                    return 3;
                default:
                    return 0; /* will not occur */
                }
            /* # Turkish and Azeri */
            } else if(loc==UCASE_LOC_TURKISH && c==0x130) {
                /*
                    # I and i-dotless; I-dot and i are case pairs in Turkish and Azeri
                    # The following rules handle those cases.

                    0130; 0069; 0130; 0130; tr # LATIN CAPITAL LETTER I WITH DOT ABOVE
                    0130; 0069; 0130; 0130; az # LATIN CAPITAL LETTER I WITH DOT ABOVE
                 */
                return 0x69;
            } else if(loc==UCASE_LOC_TURKISH && c==0x307 && isPrecededBy_I(iter, context)) {
                /*
                    # When lowercasing, remove dot_above in the sequence I + dot_above, which will turn into i.
                    # This matches the behavior of the canonically equivalent I-dot_above

                    0307; ; 0307; 0307; tr After_I; # COMBINING DOT ABOVE
                    0307; ; 0307; 0307; az After_I; # COMBINING DOT ABOVE
                 */
                *pString=nullptr;
                return 0; /* remove the dot (continue without output) */
            } else if(loc==UCASE_LOC_TURKISH && c==0x49 && !isFollowedByDotAbove(iter, context)) {
                /*
                    # When lowercasing, unless an I is before a dot_above, it turns into a dotless i.

                    0049; 0131; 0049; 0049; tr Not_Before_Dot; # LATIN CAPITAL LETTER I
                    0049; 0131; 0049; 0049; az Not_Before_Dot; # LATIN CAPITAL LETTER I
                 */
                return 0x131;
            } else if(c==0x130) {
                /*
                    # Preserve canonical equivalence for I with dot. Turkic is handled below.

                    0130; 0069 0307; 0130; 0130; # LATIN CAPITAL LETTER I WITH DOT ABOVE
                 */
                *pString=iDot;
                return 2;
            } else if(  c==0x3a3 &&
                        !isFollowedByCasedLetter(iter, context, 1) &&
                        isFollowedByCasedLetter(iter, context, -1) /* -1=preceded */
            ) {
                /* greek capital sigma maps depending on surrounding cased letters (see SpecialCasing.txt) */
                /*
                    # Special case for final form of sigma

                    03A3; 03C2; 03A3; 03A3; Final_Sigma; # GREEK CAPITAL LETTER SIGMA
                 */
                return 0x3c2; /* greek small final sigma */
            } else {
                /* no known conditional special case mapping, use a normal mapping */
            }
        } else if(HAS_SLOT(excWord, UCASE_EXC_FULL_MAPPINGS)) {
            GET_SLOT_VALUE(excWord, UCASE_EXC_FULL_MAPPINGS, pe, full);
            full&=UCASE_FULL_LOWER;
            if(full!=0) {
                /* set the output pointer to the lowercase mapping */
                *pString=reinterpret_cast<const UChar *>(pe+1);

                /* return the string length */
                return full;
            }
        }

        if(HAS_SLOT(excWord, UCASE_EXC_DELTA) && UCASE_IS_UPPER_OR_TITLE(props)) {
            int32_t delta;
            GET_SLOT_VALUE(excWord, UCASE_EXC_DELTA, pe2, delta);
            return (excWord&UCASE_EXC_DELTA_IS_NEGATIVE)==0 ? c+delta : c-delta;
        }
        if(HAS_SLOT(excWord, UCASE_EXC_LOWER)) {
            GET_SLOT_VALUE(excWord, UCASE_EXC_LOWER, pe2, result);
        }
    }

    return (result==c) ? ~result : result;
}